

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,char *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  CappedArray<char,_5UL> CVar1;
  size_t local_50;
  undefined4 local_48;
  char local_44;
  CappedArray<char,_14UL> local_40;
  
  CVar1 = tryToCharSequence<signed_char,kj::CappedArray<char,5ul>>(param_2);
  local_50 = CVar1.currentSize;
  local_48 = CVar1.content._0_4_;
  local_44 = CVar1.content[4];
  toCharSequence<int&>(&local_40,(kj *)(param_2 + 4),(int *)(CVar1._8_8_ >> 0x20));
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_50,(CappedArray<char,_5UL> *)(param_2 + 8),
             (StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}